

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPlusTree.h
# Opt level: O3

BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
* __thiscall
BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
::link_leaves(BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
              *this,BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                    *previous)

{
  Array<BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_*>
  *this_00;
  ulong index;
  BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  *this_01;
  BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  **ppBVar1;
  BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  *pBVar2;
  size_t index_00;
  size_t sVar3;
  
  if (this->subset_size == 0) {
    previous = (BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                *)0x0;
  }
  else {
    this_00 = &this->subset;
    ppBVar1 = b_array::
              Array<BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_*>
              ::operator[](this_00,0);
    if ((*ppBVar1)->subset_size == 0) {
      if (previous !=
          (BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
           *)0x0) {
        ppBVar1 = b_array::
                  Array<BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_*>
                  ::operator[](this_00,0);
        previous->next = *ppBVar1;
      }
      if (this->subset_size == 1) {
        index_00 = 0;
      }
      else {
        sVar3 = 0;
        do {
          index = sVar3 + 1;
          ppBVar1 = b_array::
                    Array<BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_*>
                    ::operator[](this_00,index);
          pBVar2 = *ppBVar1;
          ppBVar1 = b_array::
                    Array<BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_*>
                    ::operator[](this_00,sVar3);
          (*ppBVar1)->next = pBVar2;
          index_00 = this->subset_size - 1;
          sVar3 = index;
        } while (index < index_00);
      }
      ppBVar1 = b_array::
                Array<BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_*>
                ::operator[](this_00,index_00);
      previous = *ppBVar1;
    }
    else if (this->subset_size != 1) {
      sVar3 = 0;
      do {
        ppBVar1 = b_array::
                  Array<BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_*>
                  ::operator[](this_00,sVar3);
        pBVar2 = *ppBVar1;
        sVar3 = sVar3 + 1;
        ppBVar1 = b_array::
                  Array<BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_*>
                  ::operator[](this_00,sVar3);
        this_01 = *ppBVar1;
        pBVar2 = link_leaves(pBVar2,previous);
        previous = link_leaves(this_01,pBVar2);
      } while (sVar3 < this->subset_size - 1);
    }
  }
  return previous;
}

Assistant:

bool is_leaf() const { return subset_size == 0; }